

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp_analyze.hpp
# Opt level: O3

idx_t duckdb::ChimpFinalAnalyze<double>(AnalyzeState *state)

{
  InternalException *this;
  string local_40;
  
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Chimp has been deprecated, can no longer be used to compress data"
             ,"");
  InternalException::InternalException(this,&local_40);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

idx_t ChimpFinalAnalyze(AnalyzeState &state) {
	throw InternalException("Chimp has been deprecated, can no longer be used to compress data");
}